

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebFront.hpp
# Opt level: O2

void __thiscall
webfront::
BasicWF<webfront::networking::TCPNetworkingTS,_webfront::fs::Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::ReactFS,_webfront::fs::BabelFS>_>
::onEvent(BasicWF<webfront::networking::TCPNetworkingTS,_webfront::fs::Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::ReactFS,_webfront::fs::BabelFS>_>
          *this,WebLinkEvent *event)

{
  Code CVar1;
  mapped_type *this_00;
  BasicUI<webfront::BasicWF<webfront::networking::TCPNetworkingTS,_webfront::fs::Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::ReactFS,_webfront::fs::BabelFS>_>_>
  __args;
  
  CVar1 = event->code;
  if (CVar1 == cppFunctionCalled) {
    this_00 = http::std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::span<const_std::byte,_18446744073709551615UL>)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::span<const_std::byte,_18446744073709551615UL>)>_>_>_>
              ::at(&this->cppFunctions,&event->text);
    http::std::function<void_(std::span<const_std::byte,_18446744073709551615UL>)>::operator()
              (this_00,event->data);
    return;
  }
  if (CVar1 != closed) {
    if (CVar1 == linked) {
      __args.webLinkId = event->webLinkId;
      __args._10_2_ = *(undefined2 *)&event->field_0x6;
      __args.webFront = this;
      __args._12_4_ = 0;
      http::std::
      function<void_(webfront::BasicUI<webfront::BasicWF<webfront::networking::TCPNetworkingTS,_webfront::fs::Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::ReactFS,_webfront::fs::BabelFS>_>_>)>
      ::operator()(&this->uiStartedHandler,__args);
      return;
    }
    return;
  }
  http::std::
  _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_webfront::WebLink<webfront::networking::TCPNetworkingTS>_>,_std::_Select1st<std::pair<const_unsigned_short,_webfront::WebLink<webfront::networking::TCPNetworkingTS>_>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_webfront::WebLink<webfront::networking::TCPNetworkingTS>_>_>_>
  ::erase(&(this->webLinks)._M_t,&event->webLinkId);
  return;
}

Assistant:

void onEvent(WebLinkEvent event) {
        switch (event.code) {
        case WebLinkEvent::Code::linked: uiStartedHandler(UI{*this, event.webLinkId}); break;
        case WebLinkEvent::Code::closed: webLinks.erase(event.webLinkId); break;
        case WebLinkEvent::Code::cppFunctionCalled: cppFunctions.at(event.text)(event.data); break;
        }
    }